

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  ImVec2 IVar1;
  ImVec2 *pIVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ImDrawIdx IVar7;
  ImDrawIdx IVar8;
  ImDrawIdx IVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  if (2 < points_count) {
    IVar1 = this->_Data->TexUvWhitePixel;
    if ((this->Flags & 4) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      for (uVar6 = 0; (uint)points_count != uVar6; uVar6 = uVar6 + 1) {
        this->_VtxWritePtr->pos = points[uVar6];
        this->_VtxWritePtr->uv = IVar1;
        this->_VtxWritePtr->col = col;
        this->_VtxWritePtr = this->_VtxWritePtr + 1;
      }
      iVar3 = 0;
      while (points_count + -2 != iVar3) {
        *this->_IdxWritePtr = (ImDrawIdx)this->_VtxCurrentIdx;
        this->_IdxWritePtr[1] = (short)this->_VtxCurrentIdx + (short)(iVar3 + 1);
        this->_IdxWritePtr[2] = (short)iVar3 + (short)this->_VtxCurrentIdx + 2;
        this->_IdxWritePtr = this->_IdxWritePtr + 3;
        iVar3 = iVar3 + 1;
      }
      uVar4 = points_count & 0xffff;
    }
    else {
      fVar14 = this->_FringeScale;
      PrimReserve(this,points_count * 9 + -6,points_count * 2);
      uVar4 = this->_VtxCurrentIdx;
      iVar3 = uVar4 + 2;
      for (iVar5 = 2; IVar9 = (ImDrawIdx)uVar4, points_count != iVar5; iVar5 = iVar5 + 1) {
        *this->_IdxWritePtr = IVar9;
        this->_IdxWritePtr[1] = (ImDrawIdx)iVar3;
        iVar3 = iVar3 + 2;
        this->_IdxWritePtr[2] = (ImDrawIdx)iVar3;
        this->_IdxWritePtr = this->_IdxWritePtr + 3;
      }
      ImVector<ImVec2>::reserve_discard(&this->_Data->TempBuffer,points_count);
      pIVar2 = (this->_Data->TempBuffer).Data;
      iVar5 = points_count + -1;
      iVar3 = iVar5;
      for (uVar6 = 0; (uint)points_count != uVar6; uVar6 = uVar6 + 1) {
        fVar10 = points[uVar6].x - points[iVar3].x;
        fVar11 = points[uVar6].y - points[iVar3].y;
        fVar12 = fVar10 * fVar10 + fVar11 * fVar11;
        if (0.0 < fVar12) {
          fVar12 = 1.0 / SQRT(fVar12);
          fVar10 = fVar10 * fVar12;
          fVar11 = fVar11 * fVar12;
        }
        pIVar2[iVar3].x = fVar11;
        pIVar2[iVar3].y = -fVar10;
        iVar3 = (int)uVar6;
      }
      fVar14 = fVar14 * 0.5;
      for (uVar6 = 0; (uint)points_count != uVar6; uVar6 = uVar6 + 1) {
        fVar10 = (pIVar2[uVar6].x + pIVar2[iVar5].x) * 0.5;
        fVar11 = (pIVar2[uVar6].y + pIVar2[iVar5].y) * 0.5;
        fVar12 = fVar10 * fVar10 + fVar11 * fVar11;
        if (1e-06 < fVar12) {
          fVar12 = 1.0 / fVar12;
          fVar13 = 100.0;
          if (fVar12 <= 100.0) {
            fVar13 = fVar12;
          }
          fVar10 = fVar10 * fVar13;
          fVar11 = fVar11 * fVar13;
        }
        fVar10 = fVar14 * fVar10;
        fVar11 = fVar11 * fVar14;
        (this->_VtxWritePtr->pos).x = points[uVar6].x - fVar10;
        (this->_VtxWritePtr->pos).y = points[uVar6].y - fVar11;
        this->_VtxWritePtr->uv = IVar1;
        this->_VtxWritePtr->col = col;
        this->_VtxWritePtr[1].pos.x = fVar10 + points[uVar6].x;
        this->_VtxWritePtr[1].pos.y = fVar11 + points[uVar6].y;
        this->_VtxWritePtr[1].uv = IVar1;
        this->_VtxWritePtr[1].col = col & 0xffffff;
        this->_VtxWritePtr = this->_VtxWritePtr + 2;
        IVar7 = (ImDrawIdx)uVar4;
        *this->_IdxWritePtr = IVar7;
        this->_IdxWritePtr[1] = IVar9 + (short)iVar5 * 2;
        IVar8 = IVar9 + 1 + (short)iVar5 * 2;
        this->_IdxWritePtr[2] = IVar8;
        this->_IdxWritePtr[3] = IVar8;
        this->_IdxWritePtr[4] = IVar7 + 1;
        this->_IdxWritePtr[5] = IVar7;
        this->_IdxWritePtr = this->_IdxWritePtr + 6;
        iVar5 = (int)uVar6;
        uVar4 = uVar4 + 2;
      }
      uVar4 = points_count * 2 & 0xfffe;
    }
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + uVar4;
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2)*3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + ((i - 1) << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (i << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        _Data->TempBuffer.reserve_discard(points_count);
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + i - 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}